

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

ptls_private_key_result_t
sign_finish(ptls_sign_certificate_t *do_sign,ptls_t *tls,uint16_t *selected_algorithm,
           ptls_buffer_t *output)

{
  bool bVar1;
  int iVar2;
  ptls_private_key_result_t pVar3;
  ptls_iovec_t pVar4;
  
  iVar2 = retry_count + 1;
  pVar3 = ptls_private_key_retry;
  bVar1 = 1 < retry_count;
  retry_count = iVar2;
  if (bVar1) {
    pVar4.len = in.len;
    pVar4.base = in.base;
    iVar2 = (*do_sign->cb)(do_sign,tls,selected_algorithm,output,pVar4,algos,num_algos);
    free(in.base);
    free(algos);
    pVar3 = (uint)(iVar2 != 0) * 2;
  }
  return pVar3;
}

Assistant:

enum ptls_private_key_result_t sign_finish(ptls_sign_certificate_t *do_sign,
                                           ptls_t *tls,
                                           uint16_t *selected_algorithm,
                                           ptls_buffer_t *output)
{
    msg("sign_finish");
    ++retry_count;
    if (retry_count <= 2)
    {
        msg("retry again");
        return ptls_private_key_retry;
    }
    int rc = do_sign->cb(do_sign, tls, selected_algorithm, output, in, algos,
                         num_algos);
    free(in.base);
    free(algos);
    msg("sign_finish ret: %d", rc);
    if (rc == 0)
        return ptls_private_key_success;
    return ptls_private_key_failure;
}